

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

long dprintf_DollarString(char *input,char **end)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  
  ppuVar2 = __ctype_b_loc();
  bVar4 = *input;
  uVar5 = (ulong)bVar4;
  iVar1 = 0;
  if ((*(byte *)((long)*ppuVar2 + uVar5 * 2 + 1) & 8) != 0) {
    iVar1 = 0;
    do {
      iVar1 = (int)(char)uVar5 + iVar1 * 10 + -0x30;
      bVar4 = input[1];
      uVar5 = (ulong)bVar4;
      input = input + 1;
    } while ((*(byte *)((long)*ppuVar2 + uVar5 * 2 + 1) & 8) != 0);
  }
  if (bVar4 == 0x24 && iVar1 != 0) {
    *end = input + 1;
    lVar3 = (long)iVar1;
  }
  else {
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number=0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}